

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_parse_input(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r)

{
  int iVar1;
  mpc_input_t *i_00;
  void *pvVar2;
  mpc_err_t *pmVar3;
  undefined8 *in_RDX;
  mpc_err_t *in_RDI;
  int in_stack_0000000c;
  mpc_err_t **in_stack_00000010;
  mpc_result_t *in_stack_00000018;
  mpc_parser_t *in_stack_00000020;
  mpc_input_t *in_stack_00000028;
  mpc_err_t *e;
  int x;
  mpc_err_t *in_stack_ffffffffffffffa8;
  mpc_input_t *in_stack_ffffffffffffffb8;
  mpc_input_t *in_stack_ffffffffffffffc0;
  mpc_input_t *in_stack_ffffffffffffffc8;
  long local_30;
  
  i_00 = (mpc_input_t *)mpc_err_fail(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
  mpc_state_invalid();
  *(mpc_input_t **)i_00 = in_stack_ffffffffffffffb8;
  i_00->filename = (char *)in_stack_ffffffffffffffc0;
  (i_00->state).pos = (long)in_stack_ffffffffffffffc8;
  (i_00->state).row = local_30;
  iVar1 = mpc_parse_run(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                        in_stack_0000000c);
  if (iVar1 == 0) {
    mpc_err_merge(in_stack_ffffffffffffffc0,(mpc_err_t *)in_stack_ffffffffffffffb8,(mpc_err_t *)i_00
                 );
    pmVar3 = mpc_err_export(i_00,in_RDI);
    *in_RDX = pmVar3;
  }
  else {
    mpc_err_delete_internal(i_00,in_stack_ffffffffffffffa8);
    pvVar2 = mpc_export(in_stack_ffffffffffffffb8,i_00);
    *in_RDX = pvVar2;
  }
  return iVar1;
}

Assistant:

int mpc_parse_input(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r) {
  int x;
  mpc_err_t *e = mpc_err_fail(i, "Unknown Error");
  e->state = mpc_state_invalid();
  x = mpc_parse_run(i, p, r, &e, 0);
  if (x) {
    mpc_err_delete_internal(i, e);
    r->output = mpc_export(i, r->output);
  } else {
    r->error = mpc_err_export(i, mpc_err_merge(i, e, r->error));
  }
  return x;
}